

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O3

bool __thiscall
BlockFilterIndex::LookupFilterHeader
          (BlockFilterIndex *this,CBlockIndex *block_index,uint256 *header_out)

{
  uint256 *puVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  __node_base_ptr p_Var7;
  int iVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  DBVal entry;
  unique_lock<std::mutex> local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  DBVal local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._M_device = &(this->m_cs_headers_cache).super_mutex;
  local_a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_a8);
  iVar8 = block_index->nHeight % 1000;
  if (iVar8 == 0) {
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) goto LAB_00473b6e;
    local_78.hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_78.hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_78.hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_78.hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    p_Var7 = std::
             _Hashtable<uint256,_std::pair<const_uint256,_uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_FilterHeaderHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_headers_cache)._M_h,
                        (ulong)local_78.hash.super_base_blob<256U>.m_data._M_elems._0_8_ %
                        (this->m_headers_cache)._M_h._M_bucket_count,&local_78.hash,
                        local_78.hash.super_base_blob<256U>.m_data._M_elems._0_8_);
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0)) {
      p_Var3 = p_Var2[5]._M_nxt;
      p_Var4 = p_Var2[6]._M_nxt;
      p_Var5 = p_Var2[8]._M_nxt;
      *(_Hash_node_base **)((header_out->super_base_blob<256U>).m_data._M_elems + 0x10) =
           p_Var2[7]._M_nxt;
      *(_Hash_node_base **)((header_out->super_base_blob<256U>).m_data._M_elems + 0x18) = p_Var5;
      *(_Hash_node_base **)(header_out->super_base_blob<256U>).m_data._M_elems = p_Var3;
      *(_Hash_node_base **)((header_out->super_base_blob<256U>).m_data._M_elems + 8) = p_Var4;
      bVar6 = true;
      goto LAB_00473b44;
    }
  }
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_78.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_78.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_78.pos.nFile = -1;
  local_78.pos.nPos = 0;
  bVar6 = LookupOne(&((this->m_db)._M_t.
                      super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t
                      .super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                      super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper,
                    block_index,&local_78);
  if (bVar6) {
    if ((iVar8 == 0) && ((this->m_headers_cache)._M_h._M_element_count < 2000)) {
      puVar1 = block_index->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
LAB_00473b6e:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_98 = *(undefined4 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uStack_94 = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 4);
      uStack_90 = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      uStack_8c = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0xc);
      local_88 = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_84 = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x14);
      uStack_80 = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      uStack_7c = *(undefined4 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x1c);
      std::
      _Hashtable<uint256,std::pair<uint256_const,uint256>,std::allocator<std::pair<uint256_const,uint256>>,std::__detail::_Select1st,std::equal_to<uint256>,FilterHeaderHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<uint256,uint256&>
                ((_Hashtable<uint256,std::pair<uint256_const,uint256>,std::allocator<std::pair<uint256_const,uint256>>,std::__detail::_Select1st,std::equal_to<uint256>,FilterHeaderHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->m_headers_cache,&local_98,&local_78.header);
    }
    *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 0x10) =
         local_78.header.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 0x18) =
         local_78.header.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(header_out->super_base_blob<256U>).m_data._M_elems =
         local_78.header.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 8) =
         local_78.header.super_base_blob<256U>.m_data._M_elems._8_8_;
  }
LAB_00473b44:
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::LookupFilterHeader(const CBlockIndex* block_index, uint256& header_out)
{
    LOCK(m_cs_headers_cache);

    bool is_checkpoint{block_index->nHeight % CFCHECKPT_INTERVAL == 0};

    if (is_checkpoint) {
        // Try to find the block in the headers cache if this is a checkpoint height.
        auto header = m_headers_cache.find(block_index->GetBlockHash());
        if (header != m_headers_cache.end()) {
            header_out = header->second;
            return true;
        }
    }

    DBVal entry;
    if (!LookupOne(*m_db, block_index, entry)) {
        return false;
    }

    if (is_checkpoint &&
        m_headers_cache.size() < CF_HEADERS_CACHE_MAX_SZ) {
        // Add to the headers cache if this is a checkpoint height.
        m_headers_cache.emplace(block_index->GetBlockHash(), entry.header);
    }

    header_out = entry.header;
    return true;
}